

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O3

RealType __thiscall
QuantLib::Constraint::update
          (Constraint *this,DynamicVector<double,_std::allocator<double>_> *params,
          DynamicVector<double,_std::allocator<double>_> *direction,RealType beta)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  uint uVar8;
  DynamicVector<double,_std::allocator<double>_> result_1;
  DynamicVector<double,_std::allocator<double>_> result;
  allocator_type local_89;
  DynamicVector<double,_std::allocator<double>_> local_88;
  RealType local_70;
  vector<double,_std::allocator<double>_> local_68;
  DynamicVector<double,_std::allocator<double>_> local_48;
  
  local_70 = beta;
  OpenMD::operator*(&local_88,beta,direction);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,
             (long)(params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_48);
  pdVar5 = (params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar1) {
    lVar7 = 0;
    do {
      pdVar6 = (double *)((long)pdVar5 + lVar7);
      *(double *)
       ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7) =
           *pdVar6 + *(double *)
                      ((long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar7);
      lVar7 = lVar7 + 8;
    } while (pdVar6 + 1 != pdVar1);
  }
  if (local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  uVar4 = (*this->impl_->_vptr_Impl[2])(this->impl_,&local_68);
  uVar8 = 0;
  while ((uVar4 & 1) == 0) {
    if (200 < uVar8) {
      builtin_strncpy(painCave.errMsg,"can\'t update parameter vector\n",0x1f);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    local_70 = local_70 * 0.5;
    OpenMD::operator*(&local_48,local_70,direction);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_88.data_,
               (long)(params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_89);
    pdVar3 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar2 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar5 != pdVar1) {
      lVar7 = 0;
      do {
        pdVar6 = (double *)((long)pdVar5 + lVar7);
        *(double *)
         ((long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7) =
             *pdVar6 + *(double *)
                        ((long)local_48.data_.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar7);
        lVar7 = lVar7 + 8;
      } while (pdVar6 + 1 != pdVar1);
    }
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (double *)0x0;
    local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pdVar2 != (double *)0x0) &&
       (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
       local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start != (double *)0x0)) {
      operator_delete(local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar8 = uVar8 + 1;
    uVar4 = (*this->impl_->_vptr_Impl[2])(this->impl_,&local_68);
  }
  OpenMD::operator*(&local_88,local_70,direction);
  pdVar1 = (params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar6 = local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar5 = (params->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar5 != pdVar1; pdVar5 = pdVar5 + 1) {
    *pdVar5 = *pdVar5 + *pdVar6;
    pdVar6 = pdVar6 + 1;
  }
  if (local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_70;
}

Assistant:

RealType Constraint::update(DynamicVector<RealType>& params,
                              const DynamicVector<RealType>& direction,
                              RealType beta) {
    RealType diff                     = beta;
    DynamicVector<RealType> newParams = params + diff * direction;
    bool valid                        = test(newParams);
    int icount                        = 0;
    while (!valid) {
      if (icount > 200) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "can't update parameter vector\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
      diff *= 0.5;
      icount++;
      newParams = params + diff * direction;
      valid     = test(newParams);
    }
    params += diff * direction;
    return diff;
  }